

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertions.h
# Opt level: O0

void __thiscall
UnitTests::Assert::Equals<char[11],std::__cxx11::string>
          (Assert *this,string *msg,char (*expected) [11],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *actual)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  ulong uVar3;
  ostream *poVar4;
  string local_288 [32];
  string local_268 [32];
  expected_got_outputter_with_coercion<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_248;
  allocator local_231;
  string local_230 [32];
  expected_got_outputter_with_coercion<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[11]>
  local_210;
  expected_got_outputter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_200;
  ostringstream local_1f8 [8];
  ostringstream s;
  string local_80 [55];
  allocator local_49;
  string local_48 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *actual_local;
  char (*expected_local) [11];
  string *msg_local;
  Assert *this_local;
  
  local_28 = actual;
  actual_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)expected;
  expected_local = (char (*) [11])msg;
  msg_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,*expected,&local_49);
  std::__cxx11::string::string(local_80,(string *)local_28);
  bVar2 = are_equal<std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_1f8);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    local_200 = stream<std::__cxx11::string>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           expected_local);
    poVar4 = details::operator<<((ostream *)local_1f8,&local_200);
    std::operator<<(poVar4," ");
  }
  poVar4 = (ostream *)std::ostream::operator<<(local_1f8,std::boolalpha);
  std::operator<<(poVar4,"\n");
  poVar4 = std::operator<<((ostream *)local_1f8,"    Expected <");
  pbVar1 = actual_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_230,(char *)pbVar1,&local_231);
  local_210 = stream_with_coercion<std::__cxx11::string,char[11]>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_230,(char (*) [11])actual_local);
  poVar4 = details::operator<<(poVar4,&local_210);
  std::operator<<(poVar4,">\n");
  std::__cxx11::string::~string(local_230);
  std::allocator<char>::~allocator((allocator<char> *)&local_231);
  poVar4 = std::operator<<((ostream *)local_1f8,"     but got <");
  std::__cxx11::string::string(local_268,(string *)local_28);
  local_248 = stream_with_coercion<std::__cxx11::string,std::__cxx11::string>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_268,local_28);
  poVar4 = details::operator<<(poVar4,&local_248);
  std::operator<<(poVar4,">\n");
  std::__cxx11::string::~string(local_268);
  std::operator<<((ostream *)local_1f8,"  ");
  std::__cxx11::ostringstream::str();
  Error(this,local_288);
}

Assistant:

void Equals(const std::string& msg, const T& expected, const U& actual) const
        {
            if (!are_equal(std::common_type_t<T, U>(expected), std::common_type_t<T, U>(actual)))
            {
                auto s = std::ostringstream{};
                if (!msg.empty())
                    s << stream(msg) << " ";

                s << std::boolalpha << "\n";
                s << "    Expected <" << stream_with_coercion(std::common_type_t<T, U>(expected), expected) << ">\n";
                s << "     but got <" << stream_with_coercion(std::common_type_t<T, U>(actual), actual) << ">\n";
                s << "  ";
                Error(s.str());
            }
        }